

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O2

wstring * cfgfile::
          format_t<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_cfgfile::qstring_trait_t>
          ::from_string(wstring *__return_storage_ptr__,
                       parser_info_t<cfgfile::qstring_trait_t> *param_1,string_t *value)

{
  QArrayDataPointer<char16_t> local_20;
  
  local_20.d = (value->m_str).d.d;
  local_20.ptr = (value->m_str).d.ptr;
  local_20.size = (value->m_str).d.size;
  if (local_20.d != (Data *)0x0) {
    LOCK();
    ((local_20.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_20.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::toStdWString_abi_cxx11_(__return_storage_ptr__,(QString *)&local_20);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_20);
  return __return_storage_ptr__;
}

Assistant:

static std::wstring from_string( const parser_info_t< qstring_trait_t > &,
		const qstring_trait_t::string_t & value )
	{
		return ((QString)value).toStdWString();
	}